

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O3

void __thiscall
duckdb::LeftDelimJoinGlobalState::Merge(LeftDelimJoinGlobalState *this,ColumnDataCollection *input)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lhs_lock);
  if (iVar1 == 0) {
    ColumnDataCollection::Combine(&this->lhs_data,input);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lhs_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void Merge(ColumnDataCollection &input) {
		lock_guard<mutex> guard(lhs_lock);
		lhs_data.Combine(input);
	}